

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_af1b6::CpuAbsoluteTest::run_readwrite_instruction
          (CpuAbsoluteTest *this,uint8_t instruction,uint8_t new_memory_content)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  uint16_t uVar2;
  undefined2 uVar3;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar4;
  char *message;
  MatcherBase<unsigned_char> MStack_a8;
  ReturnAction<unsigned_char> local_90;
  _Any_data local_80 [2];
  AssertionResult gtest_ar;
  
  uVar2 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar2;
  (this->super_CpuTest).registers.pc = uVar2;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 2;
  uVar3 = *(undefined2 *)&(this->super_CpuTest).field_0x116;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&MStack_a8,*(short *)&(this->super_CpuTest).field_0x112 + 1)
  ;
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&MStack_a8);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                      ,0x43,"mmu","read_byte(start_pc + 1)");
  testing::internal::ReturnAction<unsigned_char>::ReturnAction(&local_90,(uchar)uVar3);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_80,(ReturnAction *)&local_90);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)local_80);
  std::_Function_base::~_Function_base((_Function_base *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.value_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&MStack_a8);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&MStack_a8,*(short *)&(this->super_CpuTest).field_0x112 + 2)
  ;
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&MStack_a8);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                      ,0x45,"mmu","read_byte(start_pc + 2)");
  testing::internal::ReturnAction<unsigned_char>::ReturnAction
            (&local_90,(uchar)((ushort)uVar3 >> 8));
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_80,(ReturnAction *)&local_90);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)local_80);
  std::_Function_base::~_Function_base((_Function_base *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.value_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&MStack_a8);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&MStack_a8,
             *(unsigned_short *)&(this->super_CpuTest).field_0x116);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&MStack_a8);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)&gtest_ar,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
                      ,0x47,"mmu","read_byte(effective_address)");
  testing::internal::ReturnAction<unsigned_char>::ReturnAction
            (&local_90,(this->super_CpuTest).field_0x114);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<unsigned_char_(unsigned_short)> *)local_80,(ReturnAction *)&local_90);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)local_80);
  std::_Function_base::~_Function_base((_Function_base *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.value_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)&MStack_a8);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)local_80,
             *(unsigned_short *)&(this->super_CpuTest).field_0x116);
  testing::Matcher<unsigned_char>::Matcher
            ((Matcher<unsigned_char> *)&MStack_a8,(this->super_CpuTest).field_0x114);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)local_80,(Matcher<unsigned_char> *)&MStack_a8);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&gtest_ar,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
             ,0x4a,"mmu","write_byte(effective_address, memory_content)");
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&MStack_a8);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_80);
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)local_80,
             *(unsigned_short *)&(this->super_CpuTest).field_0x116);
  testing::Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&MStack_a8,new_memory_content);
  n_e_s::core::test::MockMmu::gmock_write_byte
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&gtest_ar,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)local_80,(Matcher<unsigned_char> *)&MStack_a8);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            ((MockSpec<void_(unsigned_short,_unsigned_char)> *)&gtest_ar,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
             ,0x4b,"mmu","write_byte(effective_address, new_memory_content)");
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_>
                *)&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_char>::~MatcherBase(&MStack_a8);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)local_80);
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)&gtest_ar,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&MStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_cpu_absolute_instructions.cpp"
               ,0x4e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&MStack_a8,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&MStack_a8);
    if ((long *)local_80[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_80[0]._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void run_readwrite_instruction(uint8_t instruction,
            uint8_t new_memory_content) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 2;

        const auto lower_address = static_cast<uint8_t>(
                effective_address & static_cast<uint16_t>(0x00FFu));
        const auto upper_address =
                static_cast<uint8_t>((effective_address & 0xFF00u) >> 8u);

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(lower_address));
        EXPECT_CALL(mmu, read_byte(start_pc + 2))
                .WillOnce(Return(upper_address));
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        // Dummy write
        EXPECT_CALL(mmu, write_byte(effective_address, memory_content));
        EXPECT_CALL(mmu, write_byte(effective_address, new_memory_content));

        step_execution(6);
        EXPECT_EQ(expected, registers);
    }